

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

bool IsValidBailOutKindAndBits(BailOutKind bailOutKind)

{
  bool bVar1;
  
  if ((bailOutKind & ~BailOutKindBits) < BailOutKindBitsStart) {
    bVar1 = (bailOutKind & ~BailOutKindValidBits[bailOutKind & ~BailOutKindBits] & BailOutKindBits)
            == BailOutInvalid;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsValidBailOutKindAndBits(IR::BailOutKind bailOutKind)
{
    IR::BailOutKind kindNoBits = bailOutKind & ~IR::BailOutKindBits;
    if (kindNoBits >= IR::BailOutKindBitsStart)
    {
        return false;
    }
    return ((bailOutKind & IR::BailOutKindBits) & ~BailOutKindValidBits[kindNoBits]) == 0;
}